

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,H10 *hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  anon_union_4_3_cc401a1e_for_u *paVar10;
  uint uVar11;
  int iVar12;
  ulong max_backward_limit;
  void *__dest;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  void *pvVar17;
  ulong uVar18;
  uint uVar19;
  uint8_t *puVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint8_t *puVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  int *piVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  uint8_t *puVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  bool bVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ulong local_2fa0;
  ulong local_2f98;
  ulong local_2f88;
  void *local_2f48;
  void *local_2f38;
  long local_2f28;
  ZopfliNode *local_2f18;
  long local_2f00;
  ulong local_2ec0;
  int orig_dist_cache [4];
  uint32_t histogram_cmd [704];
  uint32_t histogram_literal [256];
  ZopfliCostModel model;
  float cost_literal [256];
  uint32_t histogram_dist [520];
  
  max_backward_limit = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  if (num_bytes == 0) {
    bVar40 = false;
    local_2f38 = (void *)0x0;
    local_2f48 = (void *)0x0;
  }
  else {
    local_2ec0 = num_bytes * 4;
    local_2f38 = BrotliAllocate(m,local_2ec0);
    local_2f48 = (void *)0x0;
    pvVar17 = (void *)(num_bytes - 0x7f);
    if (num_bytes < 0x7f) {
      pvVar17 = local_2f48;
    }
    if (local_2ec0 != 0) {
      local_2f48 = BrotliAllocate(m,num_bytes << 5);
    }
    bVar40 = 3 < num_bytes;
    if (bVar40) {
      uVar31 = 0;
      lVar27 = 0;
      do {
        uVar28 = lVar27 + position;
        uVar26 = max_backward_limit;
        if (uVar28 < max_backward_limit) {
          uVar26 = uVar28;
        }
        uVar13 = uVar31 + 0x80;
        if (local_2ec0 < uVar13) {
          uVar14 = local_2ec0;
          if (local_2ec0 == 0) {
            uVar14 = uVar13;
          }
          do {
            uVar25 = uVar14;
            uVar14 = uVar25 * 2;
          } while (uVar25 < uVar13);
          __dest = BrotliAllocate(m,uVar25 * 8);
          if (local_2ec0 != 0) {
            memcpy(__dest,local_2f48,local_2ec0 << 3);
          }
          BrotliFree(m,local_2f48);
          local_2f48 = __dest;
          local_2ec0 = uVar25;
        }
        uVar25 = num_bytes - lVar27;
        piVar1 = (int *)((long)local_2f48 + uVar31 * 8);
        uVar13 = uVar28 & ringbuffer_mask;
        uVar14 = 0x10;
        if (params->quality == 0xb) {
          uVar14 = 0x40;
        }
        uVar18 = 0;
        if (uVar14 <= uVar28) {
          uVar18 = uVar28 - uVar14;
        }
        uVar14 = uVar28 - 1;
        uVar32 = 1;
        piVar30 = piVar1;
        if (uVar18 < uVar14) {
          puVar20 = ringbuffer + uVar13;
          uVar38 = (ulong)((uint)uVar25 & 7);
          while (uVar28 - uVar14 <= uVar26) {
            uVar33 = uVar14 & ringbuffer_mask;
            if ((*puVar20 == ringbuffer[uVar33]) && (puVar20[1] == ringbuffer[uVar33 + 1])) {
              if (7 < uVar25) {
                lVar36 = 0;
                uVar22 = 0;
LAB_0010fec5:
                if (*(ulong *)(puVar20 + uVar22 * 8) == *(ulong *)(ringbuffer + uVar22 * 8 + uVar33)
                   ) goto code_r0x0010fed2;
                uVar22 = *(ulong *)(ringbuffer + uVar22 * 8 + uVar33) ^
                         *(ulong *)(puVar20 + uVar22 * 8);
                uVar33 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                  }
                }
                uVar22 = (uVar33 >> 3 & 0x1fffffff) - lVar36;
                goto LAB_0010ff09;
              }
              uVar23 = 0;
              puVar37 = puVar20;
LAB_0010ff46:
              uVar22 = uVar23;
              if (uVar38 != 0) {
                uVar34 = uVar38 | uVar23;
                uVar35 = uVar38;
                do {
                  uVar22 = uVar23;
                  if (ringbuffer[uVar23 + uVar33] != *puVar37) break;
                  puVar37 = puVar37 + 1;
                  uVar23 = uVar23 + 1;
                  uVar35 = uVar35 - 1;
                  uVar22 = uVar34;
                } while (uVar35 != 0);
              }
LAB_0010ff09:
              if (uVar32 < uVar22) {
                *piVar30 = (int)(uVar28 - uVar14);
                piVar30[1] = (int)uVar22 << 5;
                piVar30 = piVar30 + 2;
                uVar32 = uVar22;
              }
            }
            uVar14 = uVar14 - 1;
            if ((uVar14 <= uVar18) || (2 < uVar32)) break;
          }
        }
        if (uVar32 < uVar25) {
          uVar11 = (uint)(*(int *)(ringbuffer + uVar13) * 0x1e35a7bd) >> 0xf;
          uVar18 = (ulong)hasher->buckets_[uVar11];
          uVar14 = uVar25;
          if (0x7f < uVar25) {
            hasher->buckets_[uVar11] = (uint32_t)uVar28;
            uVar14 = 0x80;
          }
          uVar38 = hasher->window_mask_;
          local_2f00 = (uVar38 & uVar28) * 2 + 1;
          local_2f28 = (uVar38 & uVar28) * 2;
          if (uVar28 != uVar18) {
            puVar20 = ringbuffer + uVar13;
            lVar36 = 0x40;
            uVar33 = 0;
            uVar22 = 0;
LAB_00110830:
            bVar41 = lVar36 != 0;
            lVar36 = lVar36 + -1;
            if ((uVar28 - uVar18 <= uVar26) && (bVar41)) {
              uVar23 = uVar22;
              if (uVar33 < uVar22) {
                uVar23 = uVar33;
              }
              if (0x80 < uVar23) {
LAB_00110fd5:
                __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                              ,0x9d,
                              "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                             );
              }
              puVar24 = ringbuffer + (uVar18 & ringbuffer_mask);
              puVar37 = puVar24 + uVar23;
              uVar35 = uVar25 - uVar23;
              if (7 < uVar35) {
                uVar39 = uVar35 & 0xfffffffffffffff8;
                lVar21 = 0;
                uVar34 = 0;
LAB_001108b1:
                if (*(ulong *)(puVar37 + uVar34 * 8) == *(ulong *)(puVar20 + uVar34 * 8 + uVar23))
                goto code_r0x001108be;
                uVar34 = *(ulong *)(puVar20 + uVar34 * 8 + uVar23) ^
                         *(ulong *)(puVar37 + uVar34 * 8);
                uVar35 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar34 = (uVar35 >> 3 & 0x1fffffff) - lVar21;
                goto LAB_001108e3;
              }
              uVar39 = 0;
              goto LAB_001109e0;
            }
          }
LAB_0010fff4:
          if (0x7f < uVar25) {
            uVar4 = hasher->invalid_pos_;
            puVar5 = hasher->forest_;
            puVar5[local_2f28] = uVar4;
            puVar5[local_2f00] = uVar4;
          }
        }
LAB_0011002f:
        lVar36 = 3;
        auVar43 = _DAT_00139170;
        auVar44 = _DAT_00139160;
        do {
          if (SUB164(auVar43 ^ _DAT_00139180,4) == -0x80000000 &&
              SUB164(auVar43 ^ _DAT_00139180,0) < -0x7fffffda) {
            orig_dist_cache[lVar36 + 1] = 0xfffffff;
            orig_dist_cache[lVar36 + 2] = 0xfffffff;
          }
          if (SUB164(auVar44 ^ _DAT_00139180,4) == -0x80000000 &&
              SUB164(auVar44 ^ _DAT_00139180,0) < -0x7fffffda) {
            orig_dist_cache[lVar36 + 3] = 0xfffffff;
            histogram_cmd[lVar36] = 0xfffffff;
          }
          lVar21 = auVar43._8_8_;
          auVar43._0_8_ = auVar43._0_8_ + 4;
          auVar43._8_8_ = lVar21 + 4;
          lVar21 = auVar44._8_8_;
          auVar44._0_8_ = auVar44._0_8_ + 4;
          auVar44._8_8_ = lVar21 + 4;
          lVar36 = lVar36 + 4;
        } while (lVar36 != 0x2b);
        uVar32 = uVar32 + 1;
        if (uVar32 < 5) {
          uVar32 = 4;
        }
        iVar12 = BrotliFindAllStaticDictionaryMatches
                           (ringbuffer + uVar13,uVar32,uVar25,histogram_cmd);
        if (iVar12 != 0) {
          if (0x24 < uVar25) {
            uVar25 = 0x25;
          }
          if (uVar32 <= uVar25) {
            iVar12 = (int)uVar32 << 5;
            do {
              uVar11 = histogram_cmd[uVar32];
              if (uVar11 < 0xfffffff) {
                uVar19 = uVar11 & 0x1f;
                *piVar30 = (uVar11 >> 5) + (int)uVar26 + 1;
                if (uVar32 == uVar19) {
                  uVar19 = 0;
                }
                piVar30[1] = uVar19 + iVar12;
                piVar30 = piVar30 + 2;
              }
              uVar32 = uVar32 + 1;
              iVar12 = iVar12 + 0x20;
            } while (uVar25 + 1 != uVar32);
          }
        }
        lVar36 = (long)piVar30 - (long)piVar1 >> 3;
        uVar14 = lVar36 + uVar31;
        uVar13 = uVar31 + 1;
        if (uVar13 < uVar14) {
          uVar11 = piVar1[1];
          lVar21 = 1;
          do {
            uVar19 = uVar11 >> 5;
            uVar11 = piVar1[lVar21 * 2 + 1];
            if (uVar11 >> 5 <= uVar19) {
              __assert_fail("BackwardMatchLength(&matches[j]) < BackwardMatchLength(&matches[j + 1])"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/backward_references_hq.c"
                            ,0x2d3,
                            "void BrotliCreateHqZopfliBackwardReferences(MemoryManager *, size_t, size_t, const uint8_t *, size_t, const BrotliEncoderParams *, H10 *, int *, size_t *, Command *, size_t *, size_t *)"
                           );
            }
            if (((uint)piVar1[lVar21 * 2 + -2] <= uVar26) &&
               ((uint)piVar1[lVar21 * 2] < (uint)piVar1[lVar21 * 2 + -2])) {
              __assert_fail("matches[j].distance > max_distance || matches[j].distance <= matches[j + 1].distance"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/backward_references_hq.c"
                            ,0x2d5,
                            "void BrotliCreateHqZopfliBackwardReferences(MemoryManager *, size_t, size_t, const uint8_t *, size_t, const BrotliEncoderParams *, H10 *, int *, size_t *, Command *, size_t *, size_t *)"
                           );
            }
            lVar21 = lVar21 + 1;
          } while (lVar36 != lVar21);
        }
        *(int *)((long)local_2f38 + lVar27 * 4) = (int)lVar36;
        if ((piVar30 != piVar1) &&
           (uVar11 = *(uint *)((long)local_2f48 + uVar14 * 8 + -4), uVar31 = uVar14, 0x28bf < uVar11
           )) {
          uVar25 = (ulong)(uVar11 >> 5);
          uVar31 = uVar28 + 1;
          uVar26 = uVar25 + uVar28;
          if ((long)pvVar17 + position <= uVar26) {
            uVar26 = (long)pvVar17 + position;
          }
          uVar18 = uVar26 - 0x3f;
          if (uVar26 < uVar28 + 0x40) {
            uVar18 = uVar31;
          }
          *(undefined8 *)piVar1 = *(undefined8 *)((long)local_2f48 + uVar14 * 8 + -8);
          *(undefined4 *)((long)local_2f38 + lVar27 * 4) = 1;
          if ((uVar28 + 0x201 <= uVar18) && (uVar31 < uVar18)) {
            uVar28 = hasher->window_mask_;
            do {
              uVar11 = (uint)(*(int *)(ringbuffer + (uVar31 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf
              ;
              uVar14 = (ulong)hasher->buckets_[uVar11];
              local_2f88 = (uVar28 & uVar31) * 2 + 1;
              local_2fa0 = (uVar28 & uVar31) * 2;
              hasher->buckets_[uVar11] = (uint32_t)uVar31;
              if (uVar31 != uVar14) {
                puVar20 = ringbuffer + (uVar31 & ringbuffer_mask);
                lVar36 = 0x40;
                uVar32 = 0;
                uVar38 = 0;
LAB_00110377:
                bVar41 = lVar36 != 0;
                lVar36 = lVar36 + -1;
                if ((uVar31 - uVar14 <= uVar28 - 0xf) && (bVar41)) {
                  uVar33 = uVar38;
                  if (uVar32 < uVar38) {
                    uVar33 = uVar32;
                  }
                  if (uVar33 < 0x81) {
                    puVar24 = ringbuffer + (uVar14 & ringbuffer_mask);
                    puVar37 = puVar24 + uVar33;
                    uVar22 = 0x80 - uVar33;
                    if (uVar33 < 0x79) {
                      uVar35 = (ulong)((uint)uVar22 & 0xf8);
                      lVar21 = 0;
                      uVar23 = 0;
LAB_001103ec:
                      if (*(ulong *)(puVar37 + uVar23 * 8) ==
                          *(ulong *)(puVar20 + uVar23 * 8 + uVar33)) goto code_r0x001103f9;
                      uVar23 = *(ulong *)(puVar20 + uVar23 * 8 + uVar33) ^
                               *(ulong *)(puVar37 + uVar23 * 8);
                      uVar22 = 0;
                      if (uVar23 != 0) {
                        for (; (uVar23 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                        }
                      }
                      uVar23 = (uVar22 >> 3 & 0x1fffffff) - lVar21;
                      goto LAB_0011041b;
                    }
                    uVar35 = 0;
                    goto LAB_001104b2;
                  }
                  goto LAB_00110fd5;
                }
              }
LAB_00110324:
              uVar4 = hasher->invalid_pos_;
              puVar5 = hasher->forest_;
              puVar5[local_2fa0] = uVar4;
              puVar5[local_2f88] = uVar4;
LAB_00110341:
              uVar31 = uVar31 + 8;
            } while (uVar31 < uVar18);
          }
          if (uVar18 < uVar26) {
            uVar31 = hasher->window_mask_;
            do {
              uVar11 = (uint)(*(int *)(ringbuffer + (uVar18 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf
              ;
              uVar28 = (ulong)hasher->buckets_[uVar11];
              local_2fa0 = (uVar31 & uVar18) * 2 + 1;
              local_2f98 = (uVar31 & uVar18) * 2;
              hasher->buckets_[uVar11] = (uint32_t)uVar18;
              if (uVar18 != uVar28) {
                puVar20 = ringbuffer + (uVar18 & ringbuffer_mask);
                lVar36 = 0x40;
                uVar14 = 0;
                uVar32 = 0;
LAB_001105af:
                bVar41 = lVar36 != 0;
                lVar36 = lVar36 + -1;
                if ((uVar18 - uVar28 <= uVar31 - 0xf) && (bVar41)) {
                  uVar38 = uVar32;
                  if (uVar14 < uVar32) {
                    uVar38 = uVar14;
                  }
                  if (uVar38 < 0x81) {
                    puVar24 = ringbuffer + (uVar28 & ringbuffer_mask);
                    puVar37 = puVar24 + uVar38;
                    uVar33 = 0x80 - uVar38;
                    if (uVar38 < 0x79) {
                      uVar23 = (ulong)((uint)uVar33 & 0xf8);
                      lVar21 = 0;
                      uVar22 = 0;
LAB_0011062d:
                      if (*(ulong *)(puVar37 + uVar22 * 8) ==
                          *(ulong *)(puVar20 + uVar22 * 8 + uVar38)) goto code_r0x0011063a;
                      uVar22 = *(ulong *)(puVar20 + uVar22 * 8 + uVar38) ^
                               *(ulong *)(puVar37 + uVar22 * 8);
                      uVar33 = 0;
                      if (uVar22 != 0) {
                        for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                        }
                      }
                      uVar22 = (uVar33 >> 3 & 0x1fffffff) - lVar21;
                      goto LAB_00110666;
                    }
                    uVar23 = 0;
                    goto LAB_0011070e;
                  }
                  goto LAB_00110fd5;
                }
              }
LAB_00110741:
              uVar4 = hasher->invalid_pos_;
              puVar5 = hasher->forest_;
              puVar5[local_2f98] = uVar4;
              puVar5[local_2fa0] = uVar4;
LAB_00110761:
              uVar18 = uVar18 + 1;
            } while (uVar18 < uVar26);
          }
          lVar36 = uVar25 - 1;
          memset((void *)((long)local_2f38 + lVar27 * 4 + 4),0,lVar36 * 4);
          lVar27 = lVar27 + lVar36;
          uVar31 = uVar13;
        }
        uVar28 = lVar27 + 4;
        lVar27 = lVar27 + 1;
      } while (uVar28 < num_bytes);
    }
    else {
      bVar40 = false;
    }
  }
  sVar6 = *num_literals;
  sVar7 = *last_insert_len;
  orig_dist_cache._0_8_ = *(undefined8 *)dist_cache;
  orig_dist_cache._8_8_ = *(undefined8 *)(dist_cache + 2);
  sVar8 = *num_commands;
  lVar27 = num_bytes + 1;
  model.num_bytes_ = num_bytes;
  if (lVar27 == 0) {
    lVar36 = 1;
    local_2f18 = (ZopfliNode *)0x0;
  }
  else {
    local_2f18 = (ZopfliNode *)BrotliAllocate(m,lVar27 * 0x10);
    lVar36 = num_bytes + 2;
    if (lVar36 == 0) {
      model.literal_costs_ = (float *)0x0;
      goto LAB_00110b3d;
    }
  }
  model.literal_costs_ = (float *)BrotliAllocate(m,lVar36 << 2);
LAB_00110b3d:
  bVar41 = true;
  lVar36 = lVar27;
  paVar10 = &local_2f18->u;
  do {
    for (; lVar36 != 0; lVar36 = lVar36 + -1) {
      ((ZopfliNode *)(paVar10 + -3))->length = 1;
      ((ZopfliNode *)(paVar10 + -3))->distance = 0;
      *(undefined8 *)(paVar10 + -1) = 0x7effc99e00000000;
      paVar10 = paVar10 + 4;
    }
    if (bVar41) {
      ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
    }
    else {
      sVar16 = *num_commands;
      memset(histogram_literal,0,0x400);
      memset(histogram_cmd,0,0xb00);
      memset(histogram_dist,0,0x820);
      if (sVar16 != sVar8) {
        lVar36 = 0;
        uVar31 = position - sVar7;
        do {
          uVar13 = (ulong)commands[lVar36].insert_len_;
          uVar11 = commands[lVar36].copy_len_;
          uVar2 = commands[lVar36].dist_prefix_;
          uVar3 = commands[lVar36].cmd_prefix_;
          histogram_cmd[uVar3] = histogram_cmd[uVar3] + 1;
          uVar28 = uVar31;
          uVar26 = uVar13;
          if (0x7f < uVar3) {
            histogram_dist[uVar2] = histogram_dist[uVar2] + 1;
          }
          for (; uVar26 != 0; uVar26 = uVar26 - 1) {
            histogram_literal[ringbuffer[uVar28 & ringbuffer_mask]] =
                 histogram_literal[ringbuffer[uVar28 & ringbuffer_mask]] + 1;
            uVar28 = uVar28 + 1;
          }
          uVar31 = uVar31 + uVar13 + (ulong)(uVar11 & 0xffffff);
          lVar36 = lVar36 + 1;
        } while (lVar36 != sVar16 - sVar8);
      }
      SetCost(histogram_literal,0x100,cost_literal);
      SetCost(histogram_cmd,0x2c0,model.cost_cmd_);
      SetCost(histogram_dist,0x208,model.cost_dist_);
      model.min_cost_cmd_ = 1.7e+38;
      lVar36 = 0;
      do {
        if (model.cost_cmd_[lVar36] <= model.min_cost_cmd_) {
          model.min_cost_cmd_ = model.cost_cmd_[lVar36];
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != 0x2c0);
      *model.literal_costs_ = 0.0;
      if (model.num_bytes_ != 0) {
        fVar42 = 0.0;
        sVar16 = 0;
        do {
          fVar42 = fVar42 + cost_literal[ringbuffer[position + sVar16 & ringbuffer_mask]];
          model.literal_costs_[sVar16 + 1] = fVar42;
          sVar16 = sVar16 + 1;
        } while (model.num_bytes_ != sVar16);
      }
    }
    *num_commands = sVar8;
    *num_literals = sVar6;
    *last_insert_len = sVar7;
    *(undefined8 *)dist_cache = orig_dist_cache._0_8_;
    *(undefined8 *)(dist_cache + 2) = orig_dist_cache._8_8_;
    uVar11 = 0x145;
    if (params->quality < 0xb) {
      uVar11 = 0x96;
    }
    local_2f18->length = 0;
    (local_2f18->u).cost = 0.0;
    histogram_cmd[0x40] = 0;
    histogram_cmd[0x41] = 0;
    if (bVar40) {
      lVar36 = 0;
      sVar16 = 0;
      do {
        sVar15 = UpdateNodes(num_bytes,position,sVar16,ringbuffer,ringbuffer_mask,
                             (BrotliEncoderParams *)(ulong)(uint)params->quality,max_backward_limit,
                             dist_cache,(ulong)*(uint *)((long)local_2f38 + sVar16 * 4),
                             (BackwardMatch *)(lVar36 * 8 + (long)local_2f48),&model,
                             (StartPosQueue *)histogram_cmd,local_2f18);
        uVar31 = 0;
        if (0x3fff < sVar15) {
          uVar31 = sVar15;
        }
        uVar28 = (ulong)*(uint *)((long)local_2f38 + sVar16 * 4);
        lVar36 = lVar36 + uVar28;
        if (((uVar28 == 1) &&
            (uVar19 = *(uint *)((long)local_2f48 + lVar36 * 8 + -4) >> 5, uVar11 < uVar19)) &&
           (uVar31 < uVar19)) {
          uVar31 = (ulong)uVar19;
        }
        if (1 < uVar31) {
          lVar21 = uVar31 - 1;
          uVar31 = sVar16 + 4;
          do {
            sVar16 = uVar31 - 3;
            if (num_bytes <= uVar31) break;
            EvaluateNode(position,sVar16,max_backward_limit,dist_cache,&model,
                         (StartPosQueue *)histogram_cmd,local_2f18);
            lVar36 = lVar36 + (ulong)*(uint *)((long)local_2f38 + uVar31 * 4 + -0xc);
            uVar31 = uVar31 + 1;
            lVar21 = lVar21 + -1;
          } while (lVar21 != 0);
        }
        uVar31 = sVar16 + 4;
        sVar16 = sVar16 + 1;
      } while (uVar31 < num_bytes);
    }
    sVar16 = ComputeShortestPathFromNodes(num_bytes,local_2f18);
    *num_commands = *num_commands + sVar16;
    BrotliZopfliCreateCommands
              (num_bytes,position,max_backward_limit,local_2f18,dist_cache,last_insert_len,commands,
               num_literals);
    bVar9 = !bVar41;
    bVar41 = false;
    lVar36 = lVar27;
    paVar10 = &local_2f18->u;
    if (bVar9) {
      BrotliFree(m,model.literal_costs_);
      model.literal_costs_ = (float *)0x0;
      BrotliFree(m,local_2f18);
      BrotliFree(m,local_2f48);
      BrotliFree(m,local_2f38);
      return;
    }
  } while( true );
code_r0x0010fed2:
  uVar22 = uVar22 + 1;
  lVar36 = lVar36 + -8;
  uVar23 = uVar25 & 0xfffffffffffffff8;
  puVar37 = puVar20 + (uVar25 & 0xfffffffffffffff8);
  if (uVar25 >> 3 == uVar22) goto LAB_0010ff46;
  goto LAB_0010fec5;
code_r0x001108be:
  uVar34 = uVar34 + 1;
  lVar21 = lVar21 + -8;
  if (uVar35 >> 3 == uVar34) goto code_r0x001108ca;
  goto LAB_001108b1;
code_r0x001108ca:
  puVar37 = puVar37 + -lVar21;
LAB_001109e0:
  uVar35 = uVar35 & 7;
  uVar34 = uVar39;
  if (uVar35 != 0) {
    uVar29 = uVar39 | uVar35;
    do {
      uVar34 = uVar39;
      if (puVar20[uVar39 + uVar23] != *puVar37) break;
      puVar37 = puVar37 + 1;
      uVar39 = uVar39 + 1;
      uVar35 = uVar35 - 1;
      uVar34 = uVar29;
    } while (uVar35 != 0);
  }
LAB_001108e3:
  uVar34 = uVar34 + uVar23;
  iVar12 = bcmp(puVar20,puVar24,uVar34);
  if (iVar12 != 0) {
LAB_00110ff4:
    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                  ,0xa2,
                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                 );
  }
  if (piVar30 == (int *)0x0) {
    piVar30 = (int *)0x0;
  }
  else if (uVar32 < uVar34) {
    *piVar30 = (int)(uVar28 - uVar18);
    piVar30[1] = (int)uVar34 << 5;
    piVar30 = piVar30 + 2;
    uVar32 = uVar34;
  }
  if (uVar14 <= uVar34) {
    if (0x7f < uVar25) {
      puVar5 = hasher->forest_;
      puVar5[local_2f28] = puVar5[(uVar18 & uVar38) * 2];
      puVar5[local_2f00] = puVar5[(uVar18 & uVar38) * 2 + 1];
    }
    goto LAB_0011002f;
  }
  puVar5 = hasher->forest_;
  if (puVar24[uVar34] < puVar20[uVar34]) {
    if (0x7f < uVar25) {
      puVar5[local_2f28] = (uint32_t)uVar18;
    }
    lVar21 = (uVar18 & uVar38) * 2 + 1;
    uVar33 = uVar34;
    uVar34 = uVar22;
    local_2f28 = lVar21;
  }
  else {
    if (0x7f < uVar25) {
      puVar5[local_2f00] = (uint32_t)uVar18;
    }
    lVar21 = (uVar18 & uVar38) * 2;
    local_2f00 = lVar21;
  }
  uVar18 = (ulong)puVar5[lVar21];
  uVar22 = uVar34;
  if (uVar28 == uVar18) goto LAB_0010fff4;
  goto LAB_00110830;
code_r0x001103f9:
  uVar23 = uVar23 + 1;
  lVar21 = lVar21 + -8;
  if (uVar22 >> 3 == uVar23) goto code_r0x00110405;
  goto LAB_001103ec;
code_r0x00110405:
  puVar37 = puVar37 + -lVar21;
LAB_001104b2:
  uVar22 = uVar22 & 7;
  uVar23 = uVar35;
  if (uVar22 != 0) {
    uVar34 = uVar35 | uVar22;
    do {
      uVar23 = uVar35;
      if (puVar20[uVar35 + uVar33] != *puVar37) break;
      puVar37 = puVar37 + 1;
      uVar35 = uVar35 + 1;
      uVar22 = uVar22 - 1;
      uVar23 = uVar34;
    } while (uVar22 != 0);
  }
LAB_0011041b:
  uVar23 = uVar23 + uVar33;
  iVar12 = bcmp(puVar20,puVar24,uVar23);
  if (iVar12 != 0) goto LAB_00110ff4;
  if (0x7f < uVar23) {
    puVar5 = hasher->forest_;
    puVar5[local_2fa0] = puVar5[(uVar14 & uVar28) * 2];
    puVar5[local_2f88] = puVar5[(uVar14 & uVar28) * 2 + 1];
    goto LAB_00110341;
  }
  uVar33 = (uVar14 & uVar28) * 2;
  puVar5 = hasher->forest_;
  if (puVar24[uVar23] < puVar20[uVar23]) {
    puVar5[local_2fa0] = (uint32_t)uVar14;
    uVar33 = uVar33 | 1;
    uVar32 = uVar23;
    uVar23 = uVar38;
    local_2fa0 = uVar33;
  }
  else {
    puVar5[local_2f88] = (uint32_t)uVar14;
    local_2f88 = uVar33;
  }
  uVar14 = (ulong)puVar5[uVar33];
  uVar38 = uVar23;
  if (uVar31 == uVar14) goto LAB_00110324;
  goto LAB_00110377;
code_r0x0011063a:
  uVar22 = uVar22 + 1;
  lVar21 = lVar21 + -8;
  if (uVar33 >> 3 == uVar22) goto code_r0x00110646;
  goto LAB_0011062d;
code_r0x00110646:
  puVar37 = puVar37 + -lVar21;
LAB_0011070e:
  uVar33 = uVar33 & 7;
  uVar22 = uVar23;
  if (uVar33 != 0) {
    uVar35 = uVar23 | uVar33;
    do {
      uVar22 = uVar23;
      if (puVar20[uVar23 + uVar38] != *puVar37) break;
      puVar37 = puVar37 + 1;
      uVar23 = uVar23 + 1;
      uVar33 = uVar33 - 1;
      uVar22 = uVar35;
    } while (uVar33 != 0);
  }
LAB_00110666:
  uVar22 = uVar22 + uVar38;
  iVar12 = bcmp(puVar20,puVar24,uVar22);
  if (iVar12 != 0) goto LAB_00110ff4;
  if (0x7f < uVar22) {
    puVar5 = hasher->forest_;
    puVar5[local_2f98] = puVar5[(uVar28 & uVar31) * 2];
    puVar5[local_2fa0] = puVar5[(uVar28 & uVar31) * 2 + 1];
    goto LAB_00110761;
  }
  uVar38 = (uVar28 & uVar31) * 2;
  puVar5 = hasher->forest_;
  if (puVar24[uVar22] < puVar20[uVar22]) {
    puVar5[local_2f98] = (uint32_t)uVar28;
    uVar38 = uVar38 | 1;
    uVar14 = uVar22;
    uVar22 = uVar32;
    local_2f98 = uVar38;
  }
  else {
    puVar5[local_2fa0] = (uint32_t)uVar28;
    local_2fa0 = uVar38;
  }
  uVar28 = (ulong)puVar5[uVar38];
  uVar32 = uVar22;
  if (uVar18 == uVar28) goto LAB_00110741;
  goto LAB_001105af;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(
    MemoryManager* m, size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, H10* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(hasher, ringbuffer, ringbuffer_mask,
        pos, max_length, max_distance, params, &matches[cur_match_pos]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      assert(BackwardMatchLength(&matches[j]) <
          BackwardMatchLength(&matches[j + 1]));
      assert(matches[j].distance > max_distance ||
             matches[j].distance <= matches[j + 1].distance);
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  InitZopfliCostModel(m, &model, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, max_backward_limit, dist_cache,
        &model, num_matches, matches, nodes);
    BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit,
        nodes, dist_cache, last_insert_len, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}